

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

void embree::avx::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  long *plVar5;
  long lVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  _func_int *p_Var11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM0 [64];
  vfloat4 a0_1;
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  vfloat4 a0;
  undefined1 auVar32 [16];
  undefined1 in_ZMM3 [64];
  float fVar33;
  float fVar38;
  float fVar39;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  vfloat4 b0;
  float fVar44;
  float fVar45;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 auVar51 [16];
  vfloat4 a1;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  a0.field_0 = in_ZMM3._0_16_;
  auVar31 = in_ZMM2._0_16_;
  auVar29 = in_ZMM0._0_16_;
  a0_1.field_0 = in_ZMM1._0_16_;
  uVar1 = prim->primID_;
  pGVar3 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var11 = *(_func_int **)&pGVar3->field_0x58;
  if ((((p_Var11 != (_func_int *)0x0) ||
       ((uVar12 = (ulong)*(uint *)(*(long *)&pGVar3[1].time_range.upper +
                                  (long)pGVar3[1].intersectionFilterN * (ulong)uVar1),
        uVar12 != 0xffffffff &&
        (p_Var11 = pGVar3[1].super_RefCount._vptr_RefCount[uVar12], p_Var11 != (_func_int *)0x0))))
      && (((ray->super_RayK<1>).mask & pGVar3->mask) != 0)) &&
     (pRVar4 = context->user, pRVar4->instID[0] == 0xffffffff)) {
    pRVar4->instID[0] = prim->instID_;
    pRVar4->instPrimID[0] = uVar1;
    uVar12 = (ulong)prim->primID_;
    plVar5 = *(long **)&pGVar3[1].fnumTimeSegments;
    iVar2 = (int)plVar5[4];
    if ((pGVar3->field_8).field_0x1 == '\x01') {
      if (iVar2 == 0x9134) {
        lVar6 = *plVar5;
        lVar13 = uVar12 * plVar5[2];
        auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),
                                ZEXT416(*(uint *)(lVar6 + 0x10 + lVar13)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar13)),0x28);
        auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar13)),
                                ZEXT416(*(uint *)(lVar6 + 0x14 + lVar13)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar13)),0x28);
        auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar13)),
                                ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),0x1c);
        auVar31 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar13)),0x28);
        auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),
                                ZEXT416(*(uint *)(lVar6 + 0x1c + lVar13)),0x1c);
        auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar13)),0x28);
      }
      else if (iVar2 == 0x9234) {
        lVar6 = *plVar5;
        lVar13 = uVar12 * plVar5[2];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(lVar6 + 4 + lVar13);
        auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),auVar23,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar29,auVar29,0x78);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar13);
        auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),auVar24,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar29,auVar29,0x78);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar13);
        auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),auVar25,0x4c);
        auVar31 = vshufps_avx(auVar29,auVar29,0x78);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar13);
        auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar13)),auVar26,0x4c);
        auVar29 = vshufps_avx(auVar29,auVar29,0x78);
      }
      else if (iVar2 == 0xb001) {
        lVar6 = *plVar5;
        lVar13 = uVar12 * plVar5[2];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar13);
        auVar31 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar6 + 8 + lVar13)),0x20);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar13);
        auVar29 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),auVar28);
        auVar23 = vshufps_avx(auVar29,auVar28,0xd8);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar13);
        auVar29 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),auVar37);
        auVar24 = vshufps_avx(auVar29,auVar37,0xd8);
        fVar33 = *(float *)(lVar6 + 0x24 + lVar13);
        fVar45 = *(float *)(lVar6 + 0x28 + lVar13);
        fVar41 = *(float *)(lVar6 + 0x2c + lVar13);
        fVar42 = *(float *)(lVar6 + 0x30 + lVar13);
        fVar48 = fVar42 * fVar42 + fVar41 * fVar41 + fVar33 * fVar33 + fVar45 * fVar45;
        auVar29 = vrsqrtss_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
        fVar38 = auVar29._0_4_;
        fVar48 = fVar38 * 1.5 + fVar38 * fVar38 * fVar38 * fVar48 * -0.5;
        auVar29 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar48 * fVar33)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar23,ZEXT416((uint)(fVar48 * fVar45)),0x30);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),
                                ZEXT416(*(uint *)(lVar6 + 4 + lVar13)),0x10);
        auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar48 * fVar42)),0x30);
        auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar13)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416((uint)(fVar48 * fVar41)),0x30);
      }
      else if (iVar2 == 0x9244) {
        lVar6 = *plVar5;
        lVar13 = uVar12 * plVar5[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + lVar13);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + 0x10 + lVar13);
        auVar31 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar13);
        auVar29 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar13);
      }
      auVar23 = vshufps_avx(auVar29,auVar29,0xff);
      auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar25 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar26 = vshufps_avx(auVar31,auVar31,0xff);
      fVar40 = auVar24._0_4_;
      fVar39 = auVar23._0_4_;
      fVar50 = auVar25._0_4_;
      fVar8 = auVar26._0_4_;
      fVar33 = fVar40 * fVar50 + fVar8 * fVar39;
      fVar42 = fVar40 * fVar50 - fVar8 * fVar39;
      fVar48 = fVar39 * fVar39 - fVar40 * fVar40;
      fVar38 = fVar40 * fVar8 - fVar50 * fVar39;
      fVar45 = fVar40 * fVar8 + fVar50 * fVar39;
      fVar41 = fVar40 * fVar39 + fVar50 * fVar8;
      fVar49 = fVar50 * fVar8 - fVar40 * fVar39;
      auVar23 = ZEXT416((uint)(-fVar8 * fVar8 + -fVar50 * fVar50 + fVar39 * fVar39 + fVar40 * fVar40
                              ));
      auVar23 = vshufps_avx(auVar23,auVar23,0);
      auVar24 = ZEXT416((uint)(fVar33 + fVar33));
      auVar24 = vshufps_avx(auVar24,auVar24,0);
      auVar25 = ZEXT416((uint)(fVar38 + fVar38));
      auVar25 = vshufps_avx(auVar25,auVar25,0);
      fVar33 = auVar23._0_4_ * 1.0 + auVar24._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
      fVar38 = auVar23._4_4_ * 0.0 + auVar24._4_4_ * 1.0 + auVar25._4_4_ * 0.0;
      fVar39 = auVar23._8_4_ * 0.0 + auVar24._8_4_ * 0.0 + auVar25._8_4_ * 1.0;
      fVar40 = auVar23._12_4_ * 0.0 + auVar24._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
      auVar23 = ZEXT416((uint)(-fVar8 * fVar8 + fVar50 * fVar50 + fVar48));
      auVar23 = vshufps_avx(auVar23,auVar23,0);
      auVar24 = ZEXT416((uint)(fVar41 + fVar41));
      auVar24 = vshufps_avx(auVar24,auVar24,0);
      auVar25 = ZEXT416((uint)(fVar42 + fVar42));
      auVar25 = vshufps_avx(auVar25,auVar25,0);
      fVar41 = auVar25._0_4_ * 1.0 + auVar23._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
      fVar42 = auVar25._4_4_ * 0.0 + auVar23._4_4_ * 1.0 + auVar24._4_4_ * 0.0;
      fVar43 = auVar25._8_4_ * 0.0 + auVar23._8_4_ * 0.0 + auVar24._8_4_ * 1.0;
      fVar44 = auVar25._12_4_ * 0.0 + auVar23._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
      auVar23 = ZEXT416((uint)(-fVar50 * fVar50 + fVar48 + fVar8 * fVar8));
      auVar24 = vshufps_avx(auVar23,auVar23,0);
      auVar23 = ZEXT416((uint)(fVar49 + fVar49));
      auVar25 = vshufps_avx(auVar23,auVar23,0);
      auVar23 = ZEXT416((uint)(fVar45 + fVar45));
      auVar26 = vshufps_avx(auVar23,auVar23,0);
      auVar23 = vshufps_avx((undefined1  [16])a0_1.field_0,ZEXT416(0) << 0x20,0xe9);
      auVar23 = vblendps_avx(auVar23,(undefined1  [16])a0.field_0,4);
      fVar45 = auVar26._0_4_ * 1.0 + auVar25._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
      fVar48 = auVar26._4_4_ * 0.0 + auVar25._4_4_ * 1.0 + auVar24._4_4_ * 0.0;
      fVar49 = auVar26._8_4_ * 0.0 + auVar25._8_4_ * 0.0 + auVar24._8_4_ * 1.0;
      fVar50 = auVar26._12_4_ * 0.0 + auVar25._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
      auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
      a0_1.field_0._0_4_ = auVar24._0_4_ * fVar33 + fVar45 * 0.0 + fVar41 * 0.0;
      a0_1.field_0._4_4_ = auVar24._4_4_ * fVar38 + fVar48 * 0.0 + fVar42 * 0.0;
      a0_1.field_0._8_4_ = auVar24._8_4_ * fVar39 + fVar49 * 0.0 + fVar43 * 0.0;
      a0_1.field_0._12_4_ = auVar24._12_4_ * fVar40 + fVar50 * 0.0 + fVar44 * 0.0;
      auVar24 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar25 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      a0.field_0._0_4_ = auVar24._0_4_ * fVar33 + fVar45 * 0.0 + auVar25._0_4_ * fVar41;
      a0.field_0._4_4_ = auVar24._4_4_ * fVar38 + fVar48 * 0.0 + auVar25._4_4_ * fVar42;
      a0.field_0._8_4_ = auVar24._8_4_ * fVar39 + fVar49 * 0.0 + auVar25._8_4_ * fVar43;
      a0.field_0._12_4_ = auVar24._12_4_ * fVar40 + fVar50 * 0.0 + auVar25._12_4_ * fVar44;
      auVar24 = vshufps_avx(auVar31,auVar31,0x55);
      auVar25 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar26 = vshufps_avx(auVar31,auVar31,0);
      auVar31._0_4_ = auVar26._0_4_ * fVar33 + auVar25._0_4_ * fVar45 + auVar24._0_4_ * fVar41;
      auVar31._4_4_ = auVar26._4_4_ * fVar38 + auVar25._4_4_ * fVar48 + auVar24._4_4_ * fVar42;
      auVar31._8_4_ = auVar26._8_4_ * fVar39 + auVar25._8_4_ * fVar49 + auVar24._8_4_ * fVar43;
      auVar31._12_4_ = auVar26._12_4_ * fVar40 + auVar25._12_4_ * fVar50 + auVar24._12_4_ * fVar44;
      auVar24 = vshufps_avx(auVar29,auVar29,0xaa);
      auVar25 = vshufps_avx(auVar29,auVar29,0x55);
      auVar26 = vshufps_avx(auVar29,auVar29,0);
      auVar29._0_4_ =
           auVar23._0_4_ + 0.0 +
           auVar26._0_4_ * fVar33 + auVar25._0_4_ * fVar41 + auVar24._0_4_ * fVar45;
      auVar29._4_4_ =
           auVar23._4_4_ + 0.0 +
           auVar26._4_4_ * fVar38 + auVar25._4_4_ * fVar42 + auVar24._4_4_ * fVar48;
      auVar29._8_4_ =
           auVar23._8_4_ + 0.0 +
           auVar26._8_4_ * fVar39 + auVar25._8_4_ * fVar43 + auVar24._8_4_ * fVar49;
      auVar29._12_4_ =
           auVar23._12_4_ + 0.0 +
           auVar26._12_4_ * fVar40 + auVar25._12_4_ * fVar44 + auVar24._12_4_ * fVar50;
    }
    else if (iVar2 == 0x9134) {
      lVar6 = *plVar5;
      lVar13 = uVar12 * plVar5[2];
      auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),
                              ZEXT416(*(uint *)(lVar6 + 0x10 + lVar13)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar13)),0x28);
      auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar13)),
                              ZEXT416(*(uint *)(lVar6 + 0x14 + lVar13)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar13)),0x28);
      auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar13)),
                              ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),0x1c);
      auVar31 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar13)),0x28);
      auVar29 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),
                              ZEXT416(*(uint *)(lVar6 + 0x1c + lVar13)),0x1c);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar13)),0x28);
    }
    else if (iVar2 == 0x9234) {
      lVar6 = *plVar5;
      lVar13 = uVar12 * plVar5[2];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)(lVar6 + 4 + lVar13);
      auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),auVar14,0x4c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar29,auVar29,0x78);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar13);
      auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),auVar15,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar29,auVar29,0x78);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar13);
      auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),auVar16,0x4c);
      auVar31 = vshufps_avx(auVar29,auVar29,0x78);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar13);
      auVar29 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar13)),auVar17,0x4c);
      auVar29 = vshufps_avx(auVar29,auVar29,0x78);
    }
    else if (iVar2 == 0xb001) {
      lVar6 = *plVar5;
      lVar13 = uVar12 * plVar5[2];
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar13);
      auVar31 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(lVar6 + 8 + lVar13)),0x20);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar13);
      auVar29 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar13)),auVar19);
      auVar23 = vshufps_avx(auVar29,auVar19,0xd8);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar13);
      auVar29 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar13)),auVar34);
      auVar24 = vshufps_avx(auVar29,auVar34,0xd8);
      fVar33 = *(float *)(lVar6 + 0x24 + lVar13);
      fVar45 = *(float *)(lVar6 + 0x28 + lVar13);
      fVar41 = *(float *)(lVar6 + 0x2c + lVar13);
      fVar42 = *(float *)(lVar6 + 0x30 + lVar13);
      fVar48 = fVar42 * fVar42 + fVar41 * fVar41 + fVar33 * fVar33 + fVar45 * fVar45;
      auVar29 = vrsqrtss_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48));
      fVar38 = auVar29._0_4_;
      fVar48 = fVar38 * 1.5 + fVar38 * fVar38 * fVar38 * fVar48 * -0.5;
      auVar29 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar48 * fVar33)),0x30);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416((uint)(fVar48 * fVar45)),0x30);
      auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar13)),
                              ZEXT416(*(uint *)(lVar6 + 4 + lVar13)),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar48 * fVar42)),0x30);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar13)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar23,ZEXT416((uint)(fVar48 * fVar41)),0x30);
    }
    else if (iVar2 == 0x9244) {
      lVar6 = *plVar5;
      lVar13 = uVar12 * plVar5[2];
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + lVar13))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar6 + 0x10 + lVar13))->v;
      auVar31 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar13);
      auVar29 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar13);
    }
    auVar23 = vshufps_avx(auVar31,auVar31,0xc9);
    auVar24 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
    auVar46._0_4_ = auVar24._0_4_ * auVar31._0_4_;
    auVar46._4_4_ = auVar24._4_4_ * auVar31._4_4_;
    auVar46._8_4_ = auVar24._8_4_ * auVar31._8_4_;
    auVar46._12_4_ = auVar24._12_4_ * auVar31._12_4_;
    auVar51._0_4_ = a0.field_0._0_4_ * auVar23._0_4_;
    auVar51._4_4_ = a0.field_0._4_4_ * auVar23._4_4_;
    auVar51._8_4_ = a0.field_0._8_4_ * auVar23._8_4_;
    auVar51._12_4_ = a0.field_0._12_4_ * auVar23._12_4_;
    auVar27 = vsubps_avx(auVar51,auVar46);
    auVar25 = vshufps_avx(auVar27,auVar27,0xc9);
    auVar26 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
    auVar35._0_4_ = a0_1.field_0._0_4_ * auVar23._0_4_;
    auVar35._4_4_ = a0_1.field_0._4_4_ * auVar23._4_4_;
    auVar35._8_4_ = a0_1.field_0._8_4_ * auVar23._8_4_;
    auVar35._12_4_ = a0_1.field_0._12_4_ * auVar23._12_4_;
    auVar30._0_4_ = auVar26._0_4_ * auVar31._0_4_;
    auVar30._4_4_ = auVar26._4_4_ * auVar31._4_4_;
    auVar30._8_4_ = auVar26._8_4_ * auVar31._8_4_;
    auVar30._12_4_ = auVar26._12_4_ * auVar31._12_4_;
    auVar28 = vsubps_avx(auVar30,auVar35);
    auVar32._0_4_ = auVar26._0_4_ * a0.field_0._0_4_;
    auVar32._4_4_ = auVar26._4_4_ * a0.field_0._4_4_;
    auVar32._8_4_ = auVar26._8_4_ * a0.field_0._8_4_;
    auVar32._12_4_ = auVar26._12_4_ * a0.field_0._12_4_;
    auVar36._0_4_ = a0_1.field_0._0_4_ * auVar24._0_4_;
    auVar36._4_4_ = a0_1.field_0._4_4_ * auVar24._4_4_;
    auVar36._8_4_ = a0_1.field_0._8_4_ * auVar24._8_4_;
    auVar36._12_4_ = a0_1.field_0._12_4_ * auVar24._12_4_;
    auVar23 = vsubps_avx(auVar36,auVar32);
    auVar31 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar24 = vunpcklps_avx(auVar25,auVar31);
    auVar26 = vunpcklps_avx(auVar27,auVar23);
    auVar23 = vinsertps_avx(auVar28,auVar28,0x4a);
    auVar31 = vdpps_avx((undefined1  [16])a0_1.field_0,auVar25,0x7f);
    auVar25 = vunpcklps_avx(auVar26,ZEXT416(auVar28._0_4_));
    auVar26 = vunpcklps_avx(auVar24,auVar23);
    auVar23 = vunpckhps_avx(auVar24,auVar23);
    auVar24 = vshufps_avx(auVar31,auVar31,0);
    auVar31 = vdivps_avx(auVar26,auVar24);
    auVar23 = vdivps_avx(auVar23,auVar24);
    auVar24 = vdivps_avx(auVar25,auVar24);
    auVar25 = vshufps_avx(auVar29,auVar29,0);
    auVar26 = vshufps_avx(auVar29,auVar29,0x55);
    auVar29 = vshufps_avx(auVar29,auVar29,0xaa);
    fVar42 = auVar24._0_4_;
    fVar49 = auVar24._4_4_;
    fVar39 = auVar24._8_4_;
    fVar44 = auVar24._12_4_;
    fVar48 = auVar23._0_4_;
    fVar50 = auVar23._4_4_;
    fVar40 = auVar23._8_4_;
    fVar9 = auVar23._12_4_;
    fVar38 = auVar31._0_4_;
    fVar8 = auVar31._4_4_;
    fVar43 = auVar31._8_4_;
    fVar10 = auVar31._12_4_;
    auVar20._0_4_ = auVar25._0_4_ * fVar38 + auVar26._0_4_ * fVar48 + auVar29._0_4_ * fVar42;
    auVar20._4_4_ = auVar25._4_4_ * fVar8 + auVar26._4_4_ * fVar50 + auVar29._4_4_ * fVar49;
    auVar20._8_4_ = auVar25._8_4_ * fVar43 + auVar26._8_4_ * fVar40 + auVar29._8_4_ * fVar39;
    auVar20._12_4_ = auVar25._12_4_ * fVar10 + auVar26._12_4_ * fVar9 + auVar29._12_4_ * fVar44;
    auVar29 = *(undefined1 (*) [16])(ray->super_RayK<1>).org.field_0.m128;
    auVar31 = *(undefined1 (*) [16])(ray->super_RayK<1>).dir.field_0.m128;
    fVar33 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar45 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar41 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar47._0_4_ = fVar41 * fVar42;
    auVar47._4_4_ = fVar41 * fVar49;
    auVar47._8_4_ = fVar41 * fVar39;
    auVar47._12_4_ = fVar41 * fVar44;
    auVar23 = vsubps_avx(auVar47,auVar20);
    auVar21._0_4_ = fVar33 * fVar38 + fVar45 * fVar48 + auVar23._0_4_;
    auVar21._4_4_ = fVar33 * fVar8 + fVar45 * fVar50 + auVar23._4_4_;
    auVar21._8_4_ = fVar33 * fVar43 + fVar45 * fVar40 + auVar23._8_4_;
    auVar21._12_4_ = fVar33 * fVar10 + fVar45 * fVar9 + auVar23._12_4_;
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar21,auVar29,8);
    (ray->super_RayK<1>).org.field_0 = aVar7;
    fVar33 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fVar45 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar41 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar22._0_4_ = fVar33 * fVar38 + fVar45 * fVar48 + fVar41 * fVar42;
    auVar22._4_4_ = fVar33 * fVar8 + fVar45 * fVar50 + fVar41 * fVar49;
    auVar22._8_4_ = fVar33 * fVar43 + fVar45 * fVar40 + fVar41 * fVar39;
    auVar22._12_4_ = fVar33 * fVar10 + fVar45 * fVar9 + fVar41 * fVar44;
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar22,auVar31,8);
    (ray->super_RayK<1>).dir.field_0 = aVar7;
    (**(code **)(p_Var11 + 0x78))(p_Var11 + 0x58,ray);
    local_48 = auVar29._0_8_;
    uStack_40 = auVar29._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_48;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_40;
    local_38 = auVar31._0_8_;
    uStack_30 = auVar31._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_38;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_30;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }